

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O2

void symtab_del(symtab *tab)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < tab->symsnum; lVar2 = lVar2 + 1) {
    free(*(void **)((long)&tab->syms->name + lVar1));
    lVar1 = lVar1 + 0x18;
  }
  free(tab->buckets);
  free(tab->syms);
  free(tab);
  return;
}

Assistant:

void symtab_del(struct symtab *tab) {
	int i;
	for (i = 0; i < tab->symsnum; i++)
		free(tab->syms[i].name);
	free(tab->buckets);
	free(tab->syms);
	free(tab);
}